

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

void UnifiedRegex::Matcher::TraceQueryContinue(uint now)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,RegexQcPhase);
  if (!bVar2) {
    return;
  }
  Output::Print(L"Regex QC");
  TraceQueryContinue::n = TraceQueryContinue::n + 1;
  uVar1 = now;
  if (TraceQueryContinue::firstQcTime != 0) {
    Output::Print(L" - frequency: %0.1f",
                  (double)(TraceQueryContinue::n * 1000) /
                  (double)(now - TraceQueryContinue::firstQcTime));
    uVar1 = TraceQueryContinue::firstQcTime;
  }
  TraceQueryContinue::firstQcTime = uVar1;
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void Matcher::TraceQueryContinue(const uint now)
    {
        if (!PHASE_TRACE1(Js::RegexQcPhase))
        {
            return;
        }

        Output::Print(_u("Regex QC"));

        static uint n = 0;
        static uint firstQcTime = 0;

        ++n;
        if (firstQcTime)
        {
            Output::Print(_u(" - frequency: %0.1f"), static_cast<double>(n * 1000) / (now - firstQcTime));
        }
        else
        {
            firstQcTime = now;
        }

        Output::Print(_u("\n"));
        Output::Flush();
    }